

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

int Scl_LibertyReadCellIsThreeState(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  Scl_Item_t *pSVar6;
  Scl_Item_t *pSVar7;
  
  uVar1 = pCell->Child;
  iVar2 = p->nItems;
  if ((int)uVar1 < iVar2) {
    if ((-1 < (int)uVar1) && (p->pItems != (Scl_Item_t *)0x0)) {
      pSVar6 = p->pItems + uVar1;
      pcVar3 = p->pContents;
      do {
        iVar5 = (pSVar6->Key).Beg;
        iVar4 = (pSVar6->Key).End - iVar5;
        iVar5 = strncmp(pcVar3 + iVar5,"pin",(long)iVar4);
        if (iVar4 == 3 && iVar5 == 0) {
          uVar1 = pSVar6->Child;
          if (iVar2 <= (int)uVar1) goto LAB_003e58dd;
          if ((-1 < (int)uVar1) && (p->pItems != (Scl_Item_t *)0x0)) {
            pSVar7 = p->pItems + uVar1;
            do {
              iVar5 = (pSVar7->Key).Beg;
              iVar4 = (pSVar7->Key).End - iVar5;
              iVar5 = strncmp(pcVar3 + iVar5,"three_state",(long)iVar4);
              if (iVar4 == 0xb && iVar5 == 0) {
                return 1;
              }
              uVar1 = pSVar7->Next;
              if (iVar2 <= (int)uVar1) goto LAB_003e58dd;
            } while ((-1 < (int)uVar1) &&
                    (pSVar7 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
          }
        }
        uVar1 = pSVar6->Next;
        if (iVar2 <= (int)uVar1) goto LAB_003e58dd;
      } while ((-1 < (int)uVar1) && (pSVar6 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
    }
    return 0;
  }
LAB_003e58dd:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

int Scl_LibertyReadCellIsThreeState( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pPin, * pItem;
    Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        Scl_ItemForEachChildName( p, pPin, pItem, "three_state" )
            return 1;
    return 0;
}